

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  size_t __size;
  int iVar1;
  int iLit0;
  int *pShift_00;
  long lVar2;
  long lVar3;
  
  iVar1 = Abc_Base2Log(nNum);
  __size = (long)nShift * 4;
  pShift_00 = (int *)malloc(__size);
  memcpy(pShift_00,pShift,__size);
  if (iVar1 < nShift) {
    lVar3 = (long)iVar1;
    iLit0 = pShift_00[lVar3];
    lVar2 = lVar3;
    while (lVar2 = lVar2 + 1, lVar2 < nShift) {
      iLit0 = Gia_ManHashOr(pNew,iLit0,pShift_00[lVar2]);
    }
    nShift = iVar1 + 1;
    pShift_00[lVar3] = iLit0;
  }
  Wlc_BlastShiftLeftInt(pNew,pNum,nNum,pShift_00,nShift,fSticky,vRes);
  free(pShift_00);
  return;
}

Assistant:

void Wlc_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    int * pShiftNew = ABC_ALLOC( int, nShift );
    memcpy( pShiftNew, pShift, sizeof(int)*nShift );
    if ( nShiftMax < nShift )
    {
        int i, iRes = pShiftNew[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShiftNew[i] );
        pShiftNew[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftLeftInt( pNew, pNum, nNum, pShiftNew, nShiftMax, fSticky, vRes );
    ABC_FREE( pShiftNew );
}